

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O2

QDataStream * operator<<(QDataStream *out,QUrl *url)

{
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_58;
  QArrayDataPointer<char> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_38.d = (Data *)0x0;
  local_38.ptr = (char *)0x0;
  local_38.size = 0;
  bVar4 = QUrl::isValid(url);
  if (bVar4) {
    QUrl::toEncoded((QByteArray *)&local_58,url,(FormattingOptions)0x1f00000);
    qVar3 = local_38.size;
    pcVar2 = local_38.ptr;
    pDVar1 = local_38.d;
    local_38.d = local_58.d;
    local_38.ptr = local_58.ptr;
    local_58.d = pDVar1;
    local_58.ptr = pcVar2;
    local_38.size = local_58.size;
    local_58.size = qVar3;
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  operator<<(out,(QByteArray *)&local_38);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return out;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator<<(QDataStream &out, const QUrl &url)
{
    QByteArray u;
    if (url.isValid())
        u = url.toEncoded();
    out << u;
    return out;
}